

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEObservation.cpp
# Opt level: O0

void __thiscall CEObservation::copy_members(CEObservation *this,CEObservation *other)

{
  undefined4 uVar1;
  CESkyCoord *in_RSI;
  CESkyCoord *in_RDI;
  
  (in_RDI->xcoord_)._vptr_CEAngle = (in_RSI->xcoord_)._vptr_CEAngle;
  (in_RDI->xcoord_).angle_ = (in_RSI->xcoord_).angle_;
  (in_RDI->ycoord_)._vptr_CEAngle = (in_RSI->ycoord_)._vptr_CEAngle;
  (in_RDI->ycoord_).angle_ = (in_RSI->ycoord_).angle_;
  CESkyCoord::operator=(in_RSI,in_RDI);
  uVar1 = *(undefined4 *)&in_RSI[1].field_0x2c;
  in_RDI[1].coord_type_ = in_RSI[1].coord_type_;
  *(undefined4 *)&in_RDI[1].field_0x2c = uVar1;
  in_RDI[2]._vptr_CESkyCoord = in_RSI[2]._vptr_CESkyCoord;
  in_RDI[2].xcoord_._vptr_CEAngle = in_RSI[2].xcoord_._vptr_CEAngle;
  return;
}

Assistant:

void CEObservation::copy_members(const CEObservation& other)
{
    // Copy the pointers (this object does not own them)
    body_     = other.body_;
    date_     = other.date_;
    observer_ = other.observer_;

    // Copy the cached values
    cached_date_       = other.cached_date_;
    cached_coords_     = other.cached_coords_;
    cached_hour_angle_ = other.cached_hour_angle_;
    cached_apparentxcoord_ = other.cached_apparentxcoord_;
    cached_apparentycoord_ = other.cached_apparentycoord_;
}